

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterface::ErrorPrinter::AddErrorOrWarning
          (ErrorPrinter *this,string_view filename,int line,int column,string_view message,
          string_view type,ostream *out)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_b8;
  size_t local_a8;
  char *local_a0;
  size_t local_98;
  char *pcStack_90;
  size_t local_88;
  char *pcStack_80;
  size_t local_68;
  char *pcStack_60;
  undefined1 local_50 [8];
  string dfile;
  ostream *out_local;
  int column_local;
  int line_local;
  ErrorPrinter *this_local;
  string_view filename_local;
  
  dfile.field_2._8_8_ = out;
  std::__cxx11::string::string((string *)local_50);
  if ((this->tree_ == (DiskSourceTree *)0x0) ||
     (local_68 = filename._M_len, pcStack_60 = filename._M_str,
     bVar1 = DiskSourceTree::VirtualFileToDiskFile(this->tree_,filename,(string *)local_50), !bVar1)
     ) {
    local_88 = filename._M_len;
    pcStack_80 = filename._M_str;
    std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)dfile.field_2._8_8_,filename);
  }
  else {
    std::operator<<((ostream *)dfile.field_2._8_8_,(string *)local_50);
  }
  if (line != -1) {
    if (this->format_ == ERROR_FORMAT_GCC) {
      poVar2 = std::operator<<((ostream *)dfile.field_2._8_8_,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,line + 1);
      poVar2 = std::operator<<(poVar2,":");
      std::ostream::operator<<(poVar2,column + 1);
    }
    else if (this->format_ == ERROR_FORMAT_MSVS) {
      poVar2 = std::operator<<((ostream *)dfile.field_2._8_8_,"(");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,line + 1);
      poVar2 = std::operator<<(poVar2,") : ");
      local_98 = type._M_len;
      pcStack_90 = type._M_str;
      pbVar3 = std::operator<<(poVar2,type);
      poVar2 = std::operator<<(pbVar3," in column=");
      std::ostream::operator<<(poVar2,column + 1);
    }
  }
  local_a8 = type._M_len;
  local_a0 = type._M_str;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"warning");
  __x._M_str = local_a0;
  __x._M_len = local_a8;
  bVar1 = std::operator==(__x,local_b8);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)dfile.field_2._8_8_,": warning: ");
    pbVar3 = std::operator<<(poVar2,message);
    std::ostream::operator<<(pbVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)dfile.field_2._8_8_,": ");
    pbVar3 = std::operator<<(poVar2,message);
    std::ostream::operator<<(pbVar3,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void AddErrorOrWarning(absl::string_view filename, int line, int column,
                         absl::string_view message, absl::string_view type,
                         std::ostream& out) {
    std::string dfile;
    if (
        tree_ != nullptr && tree_->VirtualFileToDiskFile(filename, &dfile)) {
      out << dfile;
    } else {
      out << filename;
    }

    // Users typically expect 1-based line/column numbers, so we add 1
    // to each here.
    if (line != -1) {
      // Allow for both GCC- and Visual-Studio-compatible output.
      switch (format_) {
        case CommandLineInterface::ERROR_FORMAT_GCC:
          out << ":" << (line + 1) << ":" << (column + 1);
          break;
        case CommandLineInterface::ERROR_FORMAT_MSVS:
          out << "(" << (line + 1) << ") : " << type
              << " in column=" << (column + 1);
          break;
      }
    }

    if (type == "warning") {
      out << ": warning: " << message << std::endl;
    } else {
      out << ": " << message << std::endl;
    }
  }